

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O3

bool __thiscall
snmalloc::
RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
::find(RBTree<snmalloc::BuddyChunkRep<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>,_false,_false>
       *this,RBPath *path,K value)

{
  bool bVar1;
  ulong uVar2;
  bool bVar3;
  
  if (*(path->path)._M_elems[path->length - 1].node.ptr.val < 0x200) {
    bVar3 = false;
  }
  else {
    do {
      uVar2 = *(path->path)._M_elems[path->length - 1].node.ptr.val & 0xfffffffffffffe00;
      bVar3 = uVar2 == value;
      if (bVar3) {
        return bVar3;
      }
      bVar1 = RBPath::move_inc_null(path,value <= uVar2 && !bVar3);
    } while (bVar1);
  }
  return bVar3;
}

Assistant:

ChildRef ith(size_t n)
      {
        SNMALLOC_ASSERT(length >= n);
        return path[length - n - 1].node;
      }